

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void drop_kv_on_snap_iterator_test(void)

{
  fdb_status fVar1;
  char *pcVar2;
  fdb_status s_1;
  fdb_status s;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_kvs_handle *snap_kv;
  fdb_kvs_handle *kv2;
  fdb_kvs_handle *kv;
  fdb_file_handle *f1;
  fdb_status status;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 in_stack_fffffffffffffe38;
  undefined2 uVar3;
  undefined2 in_stack_fffffffffffffe3a;
  undefined2 uVar4;
  undefined4 in_stack_fffffffffffffe3c;
  fdb_file_handle *in_stack_fffffffffffffe40;
  FILE *pFVar5;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  uint in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  fdb_iterator *in_stack_fffffffffffffe68;
  void *key;
  fdb_kvs_handle *in_stack_fffffffffffffe78;
  fdb_doc **in_stack_fffffffffffffeb0;
  fdb_iterator *in_stack_fffffffffffffeb8;
  fdb_kvs_handle *local_78;
  fdb_kvs_config *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  fdb_kvs_handle **in_stack_fffffffffffffff0;
  fdb_file_handle *in_stack_fffffffffffffff8;
  
  gettimeofday((timeval *)&stack0xfffffffffffffff0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  key = (void *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open((fdb_file_handle **)fconfig.wal_threshold,(char *)fconfig.buffercache_size,
           (fdb_config *)fconfig._0_8_);
  fdb_kvs_open_default
            (in_stack_fffffffffffffe40,
             (fdb_kvs_handle **)
             CONCAT44(in_stack_fffffffffffffe3c,
                      CONCAT22(in_stack_fffffffffffffe3a,in_stack_fffffffffffffe38)),
             (fdb_kvs_config *)0x124060);
  fdb_kvs_open(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
  fVar1 = fdb_set_kv(in_stack_fffffffffffffe78,key,(size_t)in_stack_fffffffffffffe68,
                     (void *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1556);
    drop_kv_on_snap_iterator_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1556,"void drop_kv_on_snap_iterator_test()");
  }
  fVar1 = fdb_set_kv(in_stack_fffffffffffffe78,key,(size_t)in_stack_fffffffffffffe68,
                     (void *)(ulong)in_stack_fffffffffffffe60,
                     CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pFVar5 = _stderr;
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1558);
    drop_kv_on_snap_iterator_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1558,"void drop_kv_on_snap_iterator_test()");
  }
  fdb_commit((fdb_file_handle *)
             CONCAT44(in_stack_fffffffffffffe3c,
                      CONCAT22(in_stack_fffffffffffffe3a,in_stack_fffffffffffffe38)),'\0');
  fVar1 = fdb_snapshot_open((fdb_kvs_handle *)fconfig.encryption_key.bytes._4_8_,
                            (fdb_kvs_handle **)fconfig.encryption_key._0_8_,
                            fconfig.num_bgflusher_threads);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x155d);
    drop_kv_on_snap_iterator_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x155d,"void drop_kv_on_snap_iterator_test()");
    }
  }
  uVar3 = 0;
  uVar4 = 0;
  fVar1 = fdb_iterator_init(local_78,(fdb_iterator **)&stack0xfffffffffffffe68,(void *)0x0,0,
                            (void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1561);
    drop_kv_on_snap_iterator_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1561,"void drop_kv_on_snap_iterator_test()");
    }
  }
  fVar1 = fdb_kvs_close((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffe3c,CONCAT22(uVar4,uVar3)))
  ;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1564);
    drop_kv_on_snap_iterator_test::__test_pass = 0;
    __assert_fail("status != FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1564,"void drop_kv_on_snap_iterator_test()");
  }
  fVar1 = fdb_kvs_close((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffe3c,CONCAT22(uVar4,uVar3)))
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1568);
    drop_kv_on_snap_iterator_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1568,"void drop_kv_on_snap_iterator_test()");
    }
  }
  fVar1 = fdb_kvs_remove(in_stack_fffffffffffffe40,
                         (char *)CONCAT44(in_stack_fffffffffffffe3c,CONCAT22(uVar4,uVar3)));
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x156c);
    drop_kv_on_snap_iterator_test::__test_pass = 0;
    __assert_fail("status != FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x156c,"void drop_kv_on_snap_iterator_test()");
  }
  fVar1 = fdb_iterator_get(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x156f);
    drop_kv_on_snap_iterator_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x156f,"void drop_kv_on_snap_iterator_test()");
    }
  }
  fdb_doc_free((fdb_doc *)0x1244f9);
  fVar1 = fdb_iterator_close((fdb_iterator *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1573);
    drop_kv_on_snap_iterator_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1573,"void drop_kv_on_snap_iterator_test()");
    }
  }
  fVar1 = fdb_kvs_close((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffe3c,CONCAT22(uVar4,uVar3)))
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1575);
    drop_kv_on_snap_iterator_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1575,"void drop_kv_on_snap_iterator_test()");
    }
  }
  fVar1 = fdb_kvs_close((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffe3c,CONCAT22(uVar4,uVar3)))
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1577);
    drop_kv_on_snap_iterator_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1577,"void drop_kv_on_snap_iterator_test()");
    }
  }
  fVar1 = fdb_close((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffe3c,CONCAT22(uVar4,uVar3)));
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1579);
    drop_kv_on_snap_iterator_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1579,"void drop_kv_on_snap_iterator_test()");
    }
  }
  fdb_shutdown();
  memleak_end();
  if (drop_kv_on_snap_iterator_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","drop kv other handle test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","drop kv other handle test");
  }
  return;
}

Assistant:

void drop_kv_on_snap_iterator_test(){

    TEST_INIT();
    memleak_start();

    int r;

    fdb_status status;
    fdb_file_handle *f1;
    fdb_kvs_handle *kv, *kv2, *snap_kv;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc *rdoc = NULL;
    fdb_iterator *iterator;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_open(&f1, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(f1, &kv2, &kvs_config);
    fdb_kvs_open(f1, &kv, "kv", &kvs_config);

    // write 2 seqno's
    status = fdb_set_kv(kv, (void *) "a", 1, NULL, 0);
    TEST_STATUS(status);
    status = fdb_set_kv(kv, (void *) "b", 1, NULL, 0);
    TEST_STATUS(status);
    fdb_commit(f1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // open snapshot
    status = fdb_snapshot_open(kv, &snap_kv, 2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open iterator on snapshot
    status = fdb_iterator_init(snap_kv, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_close(snap_kv);
    TEST_CHK(status != FDB_RESULT_SUCCESS);

    // close kvs
    status = fdb_kvs_close(kv);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // drop kvs
    status = fdb_kvs_remove(f1, "kv");
    TEST_CHK(status != FDB_RESULT_SUCCESS);

    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_close(snap_kv);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_close(kv2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_close(f1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("drop kv other handle test");
}